

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::toggleDecode
          (SRGBTestCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
          *uniformDataList)

{
  SRGBDecode SVar1;
  pointer pUVar2;
  SRGBTestTexture *this_00;
  int uniformIdx;
  long lVar3;
  long lVar4;
  
  lVar4 = 5;
  for (lVar3 = 0;
      pUVar2 = (uniformDataList->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)(((long)(uniformDataList->
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x30);
      lVar3 = lVar3 + 1) {
    if ((char)(&pUVar2->location)[lVar4 * 2] == '\x01') {
      this_00 = (this->m_textureSourceList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar3];
      SVar1 = this_00->m_decoding;
      if (SVar1 != SRGBDECODE_DECODE_DEFAULT) {
        SRGBTestTexture::setDecode(this_00,(int)(SVar1 + SRGBDECODE_DECODE) % 2);
      }
    }
    lVar4 = lVar4 + 6;
  }
  return;
}

Assistant:

void SRGBTestCase::toggleDecode (const std::vector<UniformData>& uniformDataList)
{
	DE_ASSERT( uniformDataList.size() <= m_textureSourceList.size() );

	for (int uniformIdx = 0; uniformIdx < (int)uniformDataList.size(); uniformIdx++)
	{
		if (uniformDataList[uniformIdx].toggleDecode == true)
		{
			if (m_textureSourceList[uniformIdx]->getDecode() == SRGBDECODE_DECODE_DEFAULT)
			{
				// cannot toggle default
				continue;
			}

			// toggle sRGB decode values (ignoring value if set to default)
			m_textureSourceList[uniformIdx]->setDecode((SRGBDecode)((m_textureSourceList[uniformIdx]->getDecode() + 1) % SRGBDECODE_DECODE_DEFAULT));
		}
	}
}